

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

Quat __thiscall rw::Matrix::getRotation(Matrix *this)

{
  float32 *pfVar1;
  Quat QVar2;
  float fVar3;
  float s;
  float32 tr;
  Matrix *this_local;
  Quat q;
  
  fVar3 = (float)(this->right).x + (float)(this->up).y + (float)(this->at).z;
  if (fVar3 <= 0.0) {
    fVar3 = (float)(this->right).x;
    pfVar1 = &(this->up).y;
    if ((fVar3 < (float)*pfVar1 || fVar3 == (float)*pfVar1) ||
       (fVar3 = (float)(this->right).x, pfVar1 = &(this->at).z,
       fVar3 < (float)*pfVar1 || fVar3 == (float)*pfVar1)) {
      fVar3 = (float)(this->up).y;
      pfVar1 = &(this->at).z;
      if (fVar3 < (float)*pfVar1 || fVar3 == (float)*pfVar1) {
        fVar3 = sqrtf((((float)(this->at).z + 1.0) - (float)(this->right).x) - (float)(this->up).y);
        fVar3 = fVar3 * 2.0;
        q.y = (float32)(((float)(this->right).y - (float)(this->up).x) / fVar3);
        this_local._0_4_ = ((float)(this->at).x + (float)(this->right).z) / fVar3;
        this_local._4_4_ = ((float)(this->at).y + (float)(this->up).z) / fVar3;
        q.x = (float32)(fVar3 / 4.0);
      }
      else {
        fVar3 = sqrtf((((float)(this->up).y + 1.0) - (float)(this->right).x) - (float)(this->at).z);
        fVar3 = fVar3 * 2.0;
        q.y = (float32)(((float)(this->at).x - (float)(this->right).z) / fVar3);
        this_local._0_4_ = ((float)(this->up).x + (float)(this->right).y) / fVar3;
        this_local._4_4_ = fVar3 / 4.0;
        q.x = (float32)(((float)(this->at).y + (float)(this->up).z) / fVar3);
      }
    }
    else {
      fVar3 = sqrtf((((float)(this->right).x + 1.0) - (float)(this->up).y) - (float)(this->at).z);
      fVar3 = fVar3 * 2.0;
      q.y = (float32)(((float)(this->up).z - (float)(this->at).y) / fVar3);
      this_local._0_4_ = fVar3 / 4.0;
      this_local._4_4_ = ((float)(this->up).x + (float)(this->right).y) / fVar3;
      q.x = (float32)(((float)(this->at).x + (float)(this->right).z) / fVar3);
    }
  }
  else {
    fVar3 = sqrtf(fVar3 + 1.0);
    fVar3 = fVar3 * 2.0;
    q.y = (float32)(fVar3 / 4.0);
    this_local._0_4_ = ((float)(this->up).z - (float)(this->at).y) / fVar3;
    this_local._4_4_ = ((float)(this->at).x - (float)(this->right).z) / fVar3;
    q.x = (float32)(((float)(this->right).y - (float)(this->up).x) / fVar3);
  }
  QVar2.y = (float32)this_local._4_4_;
  QVar2.x = (float32)this_local._0_4_;
  QVar2.z = q.x;
  QVar2.w = q.y;
  return QVar2;
}

Assistant:

Quat
Matrix::getRotation(void)
{
	Quat q = { 0.0f, 0.0f, 0.0f, 1.0f };
	float32 tr = right.x + up.y + at.z;
	float s;
	if(tr > 0.0f){
		s = sqrtf(1.0f + tr) * 2.0f;
		q.w = s / 4.0f;
		q.x = (up.z - at.y) / s;
		q.y = (at.x - right.z) / s;
		q.z = (right.y - up.x) / s;
	}else if(right.x > up.y && right.x > at.z){
		s = sqrtf(1.0f + right.x - up.y - at.z) * 2.0f;
		q.w = (up.z - at.y) / s;
		q.x = s / 4.0f;
		q.y = (up.x + right.y) / s;
		q.z = (at.x + right.z) / s;
	}else if(up.y > at.z){
		s = sqrtf(1.0f + up.y - right.x - at.z) * 2.0f;
		q.w = (at.x - right.z) / s;
		q.x = (up.x + right.y) / s;
		q.y = s / 4.0f;
		q.z = (at.y + up.z) / s;
	}else{
		s = sqrtf(1.0f + at.z - right.x - up.y) * 2.0f;
		q.w = (right.y - up.x) / s;
		q.x = (at.x + right.z) / s;
		q.y = (at.y + up.z) / s;
		q.z = s / 4.0f;
	}
	return q;
}